

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::is_supported_argument_buffer_type(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  bool bVar2;
  byte local_29;
  bool is_supported_type;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  bVar2 = false;
  if ((type->basetype == Image) && (bVar2 = false, (type->image).sampled == 2)) {
    bVar1 = Options::is_ios(&this->msl_options);
    bVar2 = false;
    if (bVar1) {
      bVar2 = (int)(this->msl_options).argument_buffers_tier < 1;
    }
  }
  local_29 = 0;
  if ((bool)(bVar2 ^ 1)) {
    bVar2 = type_is_msl_framebuffer_fetch(this,type);
    local_29 = bVar2 ^ 0xff;
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool CompilerMSL::is_supported_argument_buffer_type(const SPIRType &type) const
{
	// iOS Tier 1 argument buffers do not support writable images.
	// When the argument buffer is encoded, we don't know whether this image will have a
	// NonWritable decoration, so just use discrete arguments for all storage images on iOS.
	bool is_supported_type = !(type.basetype == SPIRType::Image &&
							   type.image.sampled == 2 &&
							   msl_options.is_ios() &&
							   msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1);
	return is_supported_type && !type_is_msl_framebuffer_fetch(type);
}